

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printAddrMode2Operand(MCInst *MI,uint Op,SStream *O)

{
  _Bool _Var1;
  MCOperand *op;
  uint in_ESI;
  MCInst *in_RDI;
  SStream *unaff_retaddr;
  MCOperand *MO1;
  SStream *in_stack_00000040;
  uint in_stack_0000004c;
  MCInst *in_stack_00000050;
  
  op = MCInst_getOperand(in_RDI,in_ESI);
  _Var1 = MCOperand_isReg(op);
  if (_Var1) {
    printAM2PreOrOffsetIndexOp(in_stack_00000050,in_stack_0000004c,in_stack_00000040);
  }
  else {
    printOperand((MCInst *)O,MO1._4_4_,unaff_retaddr);
  }
  return;
}

Assistant:

static void printAddrMode2Operand(MCInst *MI, unsigned Op, SStream *O)
{
	MCOperand *MO1 = MCInst_getOperand(MI, Op);

	if (!MCOperand_isReg(MO1)) {   // FIXME: This is for CP entries, but isn't right.
		printOperand(MI, Op, O);
		return;
	}

	printAM2PreOrOffsetIndexOp(MI, Op, O);
}